

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::UpdateParser::UpdateParser(UpdateParser *this,cmCTestSVN *svn,char *prefix)

{
  char *prefix_local;
  cmCTestSVN *svn_local;
  UpdateParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_0166f968;
  this->SVN = svn;
  cmsys::RegularExpression::RegularExpression(&this->RegexUpdate);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexUpdate,"^([ADUCGE ])([ADUCGE ])[B ] +(.+)$");
  return;
}

Assistant:

UpdateParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexUpdate.compile("^([ADUCGE ])([ADUCGE ])[B ] +(.+)$");
  }